

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O0

void __thiscall QualEngine::solve(QualEngine *this,int tstep)

{
  uint uVar1;
  QualSolver *pQVar2;
  bool bVar3;
  uint *puVar4;
  reference pvVar5;
  int local_14;
  int qstep;
  int tstep_local;
  QualEngine *this_local;
  
  if ((this->engineState == INITIALIZED) && (tstep != 0)) {
    local_14 = tstep;
    _qstep = this;
    if (this->qualTime == 0) {
      sortLinks(this);
    }
    else {
      bVar3 = flowDirectionsChanged(this);
      if (bVar3) {
        sortLinks(this);
      }
    }
    setSourceQuality(this);
    this->qualTime = local_14 + this->qualTime;
    for (; 0 < local_14; local_14 = local_14 - uVar1) {
      puVar4 = (uint *)std::min<int>(&this->qualStep,&local_14);
      uVar1 = *puVar4;
      pQVar2 = this->qualSolver;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->sortedLinks,0);
      (*pQVar2->_vptr_QualSolver[4])(pQVar2,pvVar5,(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void QualEngine::solve(int tstep)
{
    // ... check that engine has been initialized

    if ( engineState != QualEngine::INITIALIZED ) return;
    if ( tstep == 0 ) return;

   // ... topologically sort the links if flow direction has changed

    if ( qualTime == 0 ) sortLinks();
    else if ( flowDirectionsChanged() ) sortLinks();

    // ... determine external source quality

    setSourceQuality();

    // ... propagate water quality through network over a sequence
    //     of water quality time steps

    qualTime += tstep;

    while ( tstep > 0 )
    {
        int qstep = min(qualStep, tstep);
        qualSolver->solve(&sortedLinks[0], qstep);
        tstep -= qstep;
    }
}